

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedSharedMax::Run(AdvancedSharedMax *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  ulong uVar1;
  bool bVar2;
  GLuint GVar3;
  size_type sVar4;
  reference pvVar5;
  float *pfVar6;
  CallLogWrapper *this_01;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  ulong local_a0;
  size_t i;
  undefined1 local_90 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  undefined1 local_70 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedSharedMax *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1024) in;\nshared struct Type { vec4 v[2]; } g_shared[1024];\nlayout(std430) buffer Output {\n  Type g_output[1024];\n};\n\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  g_shared[id].v = vec4[2](vec4(1.0), vec4(1.0));\n  memoryBarrierShared();\n  barrier();\n\n  vec4 sum = vec4(0.0);\n  int sum_count = 0;\n  for (int i = id - 3; i < id + 4; ++i) {\n    if (id >= 0 && id < g_shared.length()) {\n      sum += g_shared[id].v[0];\n      sum += g_shared[id].v[1];\n      sum_count += 2;\n    }\n  }\n  if (any(greaterThan(abs((sum / sum_count) - vec4(1.0)), vec4(0.0000001f)))) return;\n\n  g_output[id] = g_shared[id];\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1024) in;\nshared struct Type { vec4 v[2]; } g_shared[1024];\nlayout(std430) buffer Output {\n  Type g_output[1024];\n};\n\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  g_shared[id].v = vec4[2](vec4(1.0), vec4(1.0));\n  memoryBarrierShared();\n  barrier();\n\n  vec4 sum = vec4(0.0);\n  int sum_count = 0;\n  for (int i = id - 3; i < id + 4; ++i) {\n    if (id >= 0 && id < g_shared.length()) {\n      sum += g_shared[id].v[0];\n      sum += g_shared[id].v[1];\n      sum_count += 2;\n    }\n  }\n  if (any(greaterThan(abs((sum / sum_count) - vec4(1.0)), vec4(0.0000001f)))) return;\n\n  g_output[id] = g_shared[id];\n}"
             ,&local_41);
  GVar3 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar2 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar2) {
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&data_1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70,
               0x800,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&data_1.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_buffer);
    sVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_70);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_70,0);
    pfVar6 = tcu::Vector<float,_4>::operator[](pvVar5,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,sVar4 << 4,pfVar6,0x88ea);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_70);
    this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_01,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_01,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_01,0x200);
    std::allocator<tcu::Vector<float,_4>_>::allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90,
               0x800,(allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&i + 7));
    sVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_90);
    pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_90,0);
    pfVar6 = tcu::Vector<float,_4>::operator[](pvVar5,0);
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,sVar4 << 4,pfVar6);
    for (local_a0 = 0; uVar1 = local_a0,
        sVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_90), uVar1 < sVar4; local_a0 = local_a0 + 1) {
      pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_90,local_a0);
      tcu::Vector<float,_4>::Vector(&local_b0,pvVar5);
      tcu::Vector<float,_4>::Vector(&local_c0,1.0);
      bVar2 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_b0,&local_c0);
      if (!bVar2) {
        anon_unknown_0::Output("Invalid data at index %d.\n",local_a0);
        this_local = (AdvancedSharedMax *)&DAT_ffffffffffffffff;
        bVar2 = true;
        goto LAB_00f7088c;
      }
    }
    bVar2 = false;
LAB_00f7088c:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90);
    if (!bVar2) {
      this_local = (AdvancedSharedMax *)0x0;
    }
  }
  else {
    this_local = (AdvancedSharedMax *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1024) in;" NL
			   "shared struct Type { vec4 v[2]; } g_shared[1024];" // 32768 bytes of shared memory
			NL "layout(std430) buffer Output {" NL "  Type g_output[1024];" NL "};" NL NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  g_shared[id].v = vec4[2](vec4(1.0), vec4(1.0));" NL "  memoryBarrierShared();" NL "  barrier();" NL NL
			   "  vec4 sum = vec4(0.0);" NL "  int sum_count = 0;" NL "  for (int i = id - 3; i < id + 4; ++i) {" NL
			   "    if (id >= 0 && id < g_shared.length()) {" NL "      sum += g_shared[id].v[0];" NL
			   "      sum += g_shared[id].v[1];" NL "      sum_count += 2;" NL "    }" NL "  }" NL
			   "  if (any(greaterThan(abs((sum / sum_count) - vec4(1.0)), vec4(0.0000001f)))) return;" NL NL
			   "  g_output[id] = g_shared[id];" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init buffer */
		{
			std::vector<vec4> data(1024 * 2);
			glGenBuffers(1, &m_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate buffer */
		{
			std::vector<vec4> data(1024 * 2);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(1.0f)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}